

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter_tests.c
# Opt level: O3

TestSuite * text_reporter_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("text_reporter_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/text_reporter_tests.c"
                      ,0xbf);
  set_setup(pTVar1,text_reporter_tests_setup);
  add_test_(pTVar1,"will_report_beginning_and_end_of_suites",
            &CgreenSpec__TextReporter__will_report_beginning_and_end_of_suites__);
  add_test_(pTVar1,"will_report_passed_for_test_with_one_pass_on_completion",
            &CgreenSpec__TextReporter__will_report_passed_for_test_with_one_pass_on_completion__);
  add_test_(pTVar1,"will_report_failed_once_for_each_fail",
            &CgreenSpec__TextReporter__will_report_failed_once_for_each_fail__);
  add_test_(pTVar1,"will_report_non_finishing_test",
            &CgreenSpec__TextReporter__will_report_non_finishing_test__);
  set_teardown(pTVar1,text_reporter_tests_teardown);
  return pTVar1;
}

Assistant:

TestSuite *text_reporter_tests(void) {
    TestSuite *suite = create_test_suite();
    set_setup(suite, text_reporter_tests_setup);

    add_test_with_context(suite, TextReporter, will_report_beginning_and_end_of_suites);
    add_test_with_context(suite, TextReporter, will_report_passed_for_test_with_one_pass_on_completion);
    add_test_with_context(suite, TextReporter, will_report_failed_once_for_each_fail);
    add_test_with_context(suite, TextReporter, will_report_non_finishing_test);

    set_teardown(suite, text_reporter_tests_teardown);
    return suite;
}